

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O2

Matrix3x3 * CMU462::Matrix3x3::crossProduct(Vector3D *u)

{
  double dVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  Matrix3x3 *B;
  Matrix3x3 *in_RDI;
  
  in_RDI->entries[0].x = 0.0;
  in_RDI->entries[1].y = 0.0;
  dVar1 = u->x;
  in_RDI->entries[2].y = -dVar1;
  uVar2 = *(undefined4 *)&u->y;
  uVar3 = *(uint *)((long)&u->y + 4);
  uVar4 = *(undefined4 *)&u->z;
  uVar5 = *(uint *)((long)&u->z + 4);
  *(undefined4 *)&in_RDI->entries[2].x = uVar2;
  *(uint *)((long)&in_RDI->entries[2].x + 4) = uVar3;
  *(undefined4 *)&in_RDI->entries[0].z = uVar4;
  *(uint *)((long)&in_RDI->entries[0].z + 4) = uVar5;
  *(undefined4 *)&in_RDI->entries[0].z = uVar2;
  *(uint *)((long)&in_RDI->entries[0].z + 4) = uVar3 ^ 0x80000000;
  *(undefined4 *)&in_RDI->entries[1].x = uVar4;
  *(uint *)((long)&in_RDI->entries[1].x + 4) = uVar5 ^ 0x80000000;
  in_RDI->entries[1].z = dVar1;
  in_RDI->entries[2].z = 0.0;
  return in_RDI;
}

Assistant:

Matrix3x3 Matrix3x3::crossProduct( const Vector3D& u ) {
    Matrix3x3 B;

    B(0,0) =   0.;  B(0,1) = -u.z;  B(0,2) =  u.y;
    B(1,0) =  u.z;  B(1,1) =   0.;  B(1,2) = -u.x;
    B(2,0) = -u.y;  B(2,1) =  u.x;  B(2,2) =   0.;

    return B;
  }